

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

void parallel_for_2d(thread_pool *thread_pool,_func_void_parallel_task_2d_ptr_size_t *compute,
                    parallel_task_2d *init,size_t task_size,range *range)

{
  size_t count;
  ulong uVar1;
  ulong uVar2;
  work_item *last;
  work_item *pwVar3;
  work_item *pwVar4;
  work_item *first;
  work_item *pwVar5;
  work_item *pwVar6;
  work_item *pwVar7;
  ulong uVar8;
  work_item *pwVar9;
  work_item *pwVar10;
  work_item *local_50;
  
  count = thread_pool->thread_count;
  uVar1 = count * 2;
  if (uVar1 * task_size != 0) {
    local_50 = (work_item *)malloc(uVar1 * task_size);
    if (local_50 != (work_item *)0x0) goto LAB_00101b70;
    parallel_for_2d_cold_1();
  }
  local_50 = (work_item *)0x0;
LAB_00101b70:
  (init->work_item).work_fn = (work_fn_t)compute;
  (init->work_item).next = (work_item *)0x0;
  pwVar10 = local_50;
  for (uVar8 = uVar1; uVar8 != 0; uVar8 = uVar8 - 1) {
    memcpy(pwVar10,init,task_size);
    if (uVar8 != 1) {
      pwVar10->next = (work_item *)((long)&pwVar10->work_fn + task_size);
    }
    pwVar10 = (work_item *)((long)&pwVar10->work_fn + task_size);
  }
  pwVar4 = (work_item *)range->end;
  pwVar10 = (work_item *)range[1].begin;
  uVar8 = (long)pwVar4 - range->begin;
  pwVar5 = (work_item *)range[1].end;
  uVar2 = (long)pwVar5 - (long)pwVar10;
  if (pwVar10 < pwVar5) {
    last = (work_item *)0x0;
    pwVar3 = local_50;
    first = local_50;
    do {
      pwVar6 = (work_item *)(((uVar2 / uVar1 + 1) - (ulong)(uVar2 % uVar1 == 0)) + (long)pwVar10);
      pwVar9 = pwVar5;
      if (pwVar6 < pwVar5) {
        pwVar9 = pwVar6;
      }
      pwVar7 = (work_item *)range->begin;
      if ((work_item *)range->begin < pwVar4) {
        do {
          last = pwVar3;
          if (last == (work_item *)0x0) {
            __assert_fail("current_task",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                          ,0x132,
                          "void parallel_for_2d(struct thread_pool *, void (*)(struct parallel_task_2d *, size_t), struct parallel_task_2d *, size_t, const struct range *)"
                         );
          }
          pwVar5 = (work_item *)((long)pwVar7 + ((uVar8 / uVar1 + 1) - (ulong)(uVar8 % uVar1 == 0)))
          ;
          if (pwVar5 < pwVar4) {
            pwVar4 = pwVar5;
          }
          last[1].work_fn = (work_fn_t)pwVar7;
          last[1].next = pwVar4;
          last[2].work_fn = (work_fn_t)pwVar10;
          last[2].next = pwVar9;
          pwVar3 = last->next;
          if (pwVar3 == (work_item *)0x0) {
            submit_work(thread_pool,first,last);
            pwVar3 = wait_for_completion(thread_pool,count);
            last = (work_item *)0x0;
            first = pwVar3;
          }
          pwVar4 = (work_item *)range->end;
          pwVar7 = pwVar5;
        } while (pwVar5 < pwVar4);
        pwVar5 = (work_item *)range[1].end;
      }
      pwVar10 = pwVar6;
    } while (pwVar6 < pwVar5);
    if (last != (work_item *)0x0) {
      last->next = (work_item *)0x0;
      submit_work(thread_pool,first,last);
    }
  }
  wait_for_completion(thread_pool,0);
  free(local_50);
  return;
}

Assistant:

void parallel_for_2d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_2d*, size_t),
    struct parallel_task_2d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size[] = {
        compute_chunk_size(range[0].end - range[0].begin, task_count),
        compute_chunk_size(range[1].end - range[1].begin, task_count)
    };
    for (size_t j = range[1].begin; j < range[1].end; j += chunk_size[1]) {
        size_t next_j = range_end(j, chunk_size[1], range[1].end);
        for (size_t i = range[0].begin; i < range[0].end; i += chunk_size[0]) {
            size_t next_i = range_end(i, chunk_size[0], range[0].end);
            assert(current_task);
            ((struct parallel_task_2d*)current_task)->range[0].begin = i;
            ((struct parallel_task_2d*)current_task)->range[0].end   = next_i;
            ((struct parallel_task_2d*)current_task)->range[1].begin = j;
            ((struct parallel_task_2d*)current_task)->range[1].end   = next_j;
            previous_task = current_task;
            current_task = current_task->next;
            if (!current_task) {
                submit_work(thread_pool, first_task, previous_task);
                first_task = current_task = wait_for_completion(thread_pool, thread_count);
                previous_task = NULL;
            }
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}